

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitivePacket.cpp
# Opt level: O3

void __thiscall
rr::GeometryEmitter::EmitVertex
          (GeometryEmitter *this,Vec4 *position,float pointSize,GenericVec4 *varyings,
          int primitiveID)

{
  pointer *pppVVar1;
  iterator __position;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  VertexPacket *packet;
  VertexPacket *local_28;
  
  uVar3 = this->m_numEmitted + 1;
  this->m_numEmitted = uVar3;
  if (uVar3 <= this->m_maxVertices) {
    local_28 = VertexPacketAllocator::alloc(this->m_vpalloc);
    uVar2 = *(undefined8 *)(position->m_data + 2);
    *(undefined8 *)(local_28->position).m_data = *(undefined8 *)position->m_data;
    *(undefined8 *)((local_28->position).m_data + 2) = uVar2;
    local_28->pointSize = pointSize;
    local_28->primitiveID = primitiveID;
    if (this->m_vpalloc->m_numberOfVertexOutputs != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        *(undefined4 *)((long)&local_28->outputs[0].v + lVar4) =
             *(undefined4 *)((long)&varyings->v + lVar4);
        *(undefined4 *)((long)&local_28->outputs[0].v + lVar4 + 4) =
             *(undefined4 *)((long)&varyings->v + lVar4 + 4);
        *(undefined4 *)((long)&local_28->outputs[0].v + lVar4 + 8) =
             *(undefined4 *)((long)&varyings->v + lVar4 + 8);
        *(undefined4 *)((long)&local_28->outputs[0].v + lVar4 + 0xc) =
             *(undefined4 *)((long)&varyings->v + lVar4 + 0xc);
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar3 < this->m_vpalloc->m_numberOfVertexOutputs);
    }
    __position._M_current =
         (this->m_emitted).
         super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_emitted).
        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<rr::VertexPacket*,std::allocator<rr::VertexPacket*>>::
      _M_realloc_insert<rr::VertexPacket*const&>
                ((vector<rr::VertexPacket*,std::allocator<rr::VertexPacket*>> *)this,__position,
                 &local_28);
    }
    else {
      *__position._M_current = local_28;
      pppVVar1 = &(this->m_emitted).
                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
  }
  return;
}

Assistant:

void GeometryEmitter::EmitVertex (const tcu::Vec4& position, float pointSize, const GenericVec4* varyings, int primitiveID)
{
	VertexPacket* packet;

	if (++m_numEmitted > m_maxVertices)
	{
		DE_FATAL("Undefined results, too many vertices emitted.");
		return;
	}

	packet = m_vpalloc.alloc();

	packet->position = position;
	packet->pointSize = pointSize;
	packet->primitiveID = primitiveID;

	for (size_t ndx = 0; ndx < m_vpalloc.getNumVertexOutputs(); ++ndx)
		packet->outputs[ndx] = varyings[ndx];

	m_emitted.push_back(packet);
}